

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

ContiguousMemoryRange __thiscall
protozero::StaticBufferDelegate::GetNewBuffer(StaticBufferDelegate *this)

{
  uint8_t *extraout_RAX;
  uint8_t *extraout_RDX;
  ContiguousMemoryRange CVar1;
  
  if (this->get_new_buffer_called_once_ != true) {
    this->get_new_buffer_called_once_ = true;
    return this->range_;
  }
  GetNewBuffer();
  CVar1.end = extraout_RDX;
  CVar1.begin = extraout_RAX;
  return CVar1;
}

Assistant:

ContiguousMemoryRange StaticBufferDelegate::GetNewBuffer() {
  if (get_new_buffer_called_once_) {
    // This is the 2nd time GetNewBuffer is called. The estimate is wrong. We
    // shouldn't try to grow the buffer after the initial call.
    PERFETTO_FATAL("Static buffer too small");
  }
  get_new_buffer_called_once_ = true;
  return range_;
}